

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall CppGenerator::computeViewOrdering(CppGenerator *this)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  undefined8 *puVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar2;
  uint uVar3;
  iterator iVar4;
  element_type *peVar5;
  unsigned_long *puVar6;
  ulong *puVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  size_t *psVar13;
  pointer puVar14;
  View *pVVar15;
  TDNode *pTVar16;
  size_t __n;
  long lVar17;
  ulong uVar18;
  long lVar19;
  pointer puVar20;
  CppGenerator *pCVar21;
  uint uVar22;
  ulong *puVar23;
  long lVar24;
  bool bVar25;
  ulong *puVar26;
  size_t *nodeID;
  size_t *destView;
  unsigned_long *puVar27;
  long lVar28;
  size_t *viewID;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> orderedViewList;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> nodesToProcess;
  size_t viewID_1;
  dyn_bitset queuedViews;
  dyn_bitset processedViews;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  viewsPerNode;
  allocator_type local_151;
  CppGenerator *local_150;
  size_t *local_148;
  iterator iStack_140;
  unsigned_long *local_138;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  View *local_b8;
  size_t local_b0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  long local_68;
  pointer local_60;
  long local_58;
  Aggregate *local_50;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_48;
  
  local_150 = this;
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = sVar10;
  uVar11 = SUB168(auVar8 * ZEXT816(0x18),0);
  uVar12 = uVar11 + 8;
  if (0xfffffffffffffff7 < uVar11) {
    uVar12 = 0xffffffffffffffff;
  }
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0x18),8) == 0) {
    uVar11 = uVar12;
  }
  psVar13 = (size_t *)operator_new__(uVar11);
  pCVar21 = local_150;
  *psVar13 = sVar10;
  if (sVar10 != 0) {
    lVar17 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(psVar13 + 1))->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)psVar13 + lVar17 + 0x18) = 0;
      lVar17 = lVar17 + 0x18;
    } while (sVar10 * 0x18 != lVar17);
  }
  local_150->incomingViews = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(psVar13 + 1);
  sVar10 = QueryCompiler::numberOfViews
                     ((local_150->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  psVar13 = (size_t *)operator_new__(-(ulong)(sVar10 >> 0x3d != 0) | sVar10 * 8);
  pCVar21->viewToGroupMapping = psVar13;
  sVar10 = TreeDecomposition::numberOfRelations
                     ((pCVar21->_td).
                      super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_48,sVar10,(value_type *)&local_128,(allocator_type *)&local_88);
  if (local_128._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_128._M_impl.super__Deque_impl_data._M_map);
  }
  puVar20 = (pointer)0x0;
  while (local_88.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = puVar20,
        puVar14 = (pointer)QueryCompiler::numberOfViews
                                     ((pCVar21->_qc).
                                      super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr), puVar20 < puVar14) {
    pVVar15 = QueryCompiler::getView
                        ((pCVar21->_qc).
                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (size_t)local_88.m_bits.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    pTVar16 = TreeDecomposition::getRelation
                        ((pCVar21->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar15->_origin);
    uVar3 = pVVar15->_origin;
    uVar22 = pVVar15->_destination;
    sVar10 = pTVar16->_numOfNeighbors;
    local_b8 = pVVar15;
    __n = QueryCompiler::numberOfViews
                    ((pCVar21->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
    local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_a8.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_128,__n,(bool *)&local_a8,
               (allocator_type *)&local_148);
    pVVar15 = local_b8;
    pCVar21 = local_150;
    local_60 = (local_b8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    lVar17 = (long)(local_b8->_aggregates).
                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)local_60;
    if (lVar17 != 0) {
      uVar11 = (ulong)(uVar3 != uVar22);
      lVar17 = lVar17 >> 3;
      local_68 = lVar17 + (ulong)(lVar17 == 0);
      lVar17 = 0;
      do {
        local_58 = lVar17;
        local_50 = local_60[local_58];
        lVar17 = (long)*(pointer *)
                        ((long)&(local_50->_agg).
                                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                ._M_impl + 8) -
                 *(long *)&(local_50->_agg).
                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                           ._M_impl;
        if (lVar17 != 0) {
          lVar24 = (lVar17 >> 6) * -0x5555555555555555;
          lVar17 = 0;
          lVar28 = 0;
          do {
            if (sVar10 != uVar11) {
              puVar26 = (ulong *)(lVar17 * 0x10 +
                                 *(long *)&(local_50->_incoming).
                                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                           ._M_impl.super__Vector_impl_data);
              lVar19 = 0;
              do {
                uVar12 = *puVar26;
                uVar18 = uVar12 + 0x3f;
                if (-1 < (long)uVar12) {
                  uVar18 = uVar12;
                }
                local_128._M_impl.super__Deque_impl_data._M_map
                [((long)uVar18 >> 6) +
                 ((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                     (unsigned_long *)
                     ((ulong)local_128._M_impl.super__Deque_impl_data._M_map
                             [((long)uVar18 >> 6) +
                              ((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                     1L << ((byte)uVar12 & 0x3f));
                lVar19 = lVar19 + -1;
                puVar26 = puVar26 + 2;
              } while (-lVar19 != sVar10 - uVar11);
              lVar17 = lVar17 - lVar19;
            }
            lVar28 = lVar28 + 1;
          } while (lVar28 != lVar24 + (ulong)(lVar24 == 0));
        }
        lVar17 = local_58 + 1;
      } while (local_58 + 1 != local_68);
    }
    puVar20 = (pointer)0x0;
    while (local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start = puVar20,
          puVar14 = (pointer)QueryCompiler::numberOfViews
                                       ((pCVar21->_qc).
                                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr), puVar20 < puVar14) {
      puVar20 = (pointer)((long)local_a8.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + 0x3f);
      if (-1 < (long)local_a8.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start) {
        puVar20 = local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      if (((ulong)local_128._M_impl.super__Deque_impl_data._M_map
                  [((long)puVar20 >> 6) +
                   ((ulong)(((ulong)local_a8.m_bits.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0x800000000000003f)
                           < 0x8000000000000001) - 1)] >>
           ((ulong)local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start & 0x3f) & 1) != 0) {
        pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                 (pCVar21->incomingViews +
                 (long)local_88.m_bits.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start);
        iVar4._M_current = *(unsigned_long **)(pvVar2 + 8);
        if (iVar4._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar4,(unsigned_long *)&local_a8);
        }
        else {
          *iVar4._M_current =
               (unsigned_long)
               local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
          *(unsigned_long **)(pvVar2 + 8) = iVar4._M_current + 1;
        }
      }
      puVar20 = (pointer)((long)local_a8.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
    }
    pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
             (local_48.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + pVVar15->_origin);
    iVar4._M_current = *(unsigned_long **)(pvVar2 + 8);
    if (iVar4._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar4,(unsigned_long *)&local_88);
    }
    else {
      *iVar4._M_current =
           (unsigned_long)
           local_88.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
      *(unsigned_long **)(pvVar2 + 8) = iVar4._M_current + 1;
    }
    if (local_128._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
      operator_delete(local_128._M_impl.super__Deque_impl_data._M_map);
      local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_128._M_impl.super__Deque_impl_data._M_map_size =
           local_128._M_impl.super__Deque_impl_data._M_map_size & 0xffffffff00000000;
      local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_128._M_impl.super__Deque_impl_data._M_start._M_first =
           (_Elt_pointer)
           ((ulong)local_128._M_impl.super__Deque_impl_data._M_start._M_first & 0xffffffff00000000);
      local_128._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    }
    puVar20 = (pointer)((long)local_88.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1);
  }
  sVar10 = QueryCompiler::numberOfViews
                     ((pCVar21->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_88,sVar10,0,(allocator<unsigned_long> *)&local_128);
  sVar10 = QueryCompiler::numberOfViews
                     ((pCVar21->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_a8,sVar10,0,(allocator<unsigned_long> *)&local_128);
  local_148 = (size_t *)0x0;
  iStack_140._M_current = (unsigned_long *)0x0;
  local_138 = (unsigned_long *)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = (unsigned_long *)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_last = (unsigned_long *)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (unsigned_long *)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_first = (unsigned_long *)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_128,0);
  peVar5 = (pCVar21->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar20 = (peVar5->_leafNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar14 = (peVar5->_leafNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (puVar20 != puVar14) {
    do {
      puVar6 = local_48.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*puVar20].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar27 = local_48.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[*puVar20].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar27 != puVar6; puVar27 = puVar27 + 1) {
        uVar11 = *puVar27;
        if (local_150->incomingViews[uVar11].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_150->incomingViews[uVar11].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11 >> 6] =
               local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
          if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_128._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<unsigned_long,std::allocator<unsigned_long>>::
            _M_push_back_aux<unsigned_long_const&>
                      ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_128,puVar27);
          }
          else {
            *local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = *puVar27;
            local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_128._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
      }
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar14);
  }
  pCVar21 = local_150;
  if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_128._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)*local_128._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_128._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_128._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_128._M_impl.super__Deque_impl_data._M_start._M_first);
        local_128._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_128._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_128._M_impl.super__Deque_impl_data._M_start._M_last =
             local_128._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_128._M_impl.super__Deque_impl_data._M_start._M_first =
             local_128._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_128._M_impl.super__Deque_impl_data._M_start._M_node =
             local_128._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_128._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_128._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      if (iStack_140._M_current == local_138) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_148,iStack_140,
                   (unsigned_long *)&local_d0);
      }
      else {
        *iStack_140._M_current =
             (unsigned_long)
             local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        iStack_140._M_current = iStack_140._M_current + 1;
      }
      local_88.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start
      [(ulong)local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 6] =
           local_88.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start
           [(ulong)local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 6] |
           1L << ((byte)local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0x3f);
      pVVar15 = QueryCompiler::getView
                          ((pCVar21->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (size_t)local_d0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      puVar6 = local_48.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[pVVar15->_destination].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar27 = local_48.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[pVVar15->_destination].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar27 != puVar6; puVar27 = puVar27 + 1) {
        uVar11 = *puVar27;
        uVar18 = 1L << ((byte)uVar11 & 0x3f);
        uVar12 = uVar11 >> 6;
        if ((local_88.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar12] >> (uVar11 & 0x3f) & 1) == 0) {
          puVar26 = pCVar21->incomingViews[uVar11].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar7 = pCVar21->incomingViews[uVar11].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (puVar26 != puVar7) {
            bVar25 = true;
            do {
              puVar23 = puVar26 + 1;
              uVar11 = *puVar26;
              if (((local_88.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) &&
                 ((local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11 >> 6] &
                  1L << ((byte)uVar11 & 0x3f)) == 0)) {
                bVar9 = true;
                bVar25 = false;
              }
              else {
                bVar9 = false;
              }
            } while ((!bVar9) && (puVar26 = puVar23, puVar23 != puVar7));
            pCVar21 = local_150;
            if (!bVar25) goto LAB_0022e0f9;
          }
          if ((local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar12] & uVar18) == 0) {
            local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar12] =
                 local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar12] | uVar18;
            if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_128._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<unsigned_long,std::allocator<unsigned_long>>::
              _M_push_back_aux<unsigned_long_const&>
                        ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_128,puVar27);
            }
            else {
              *local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = *puVar27;
              local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_128._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
        }
LAB_0022e0f9:
      }
    } while (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_128._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  pVVar15 = QueryCompiler::getView
                      ((pCVar21->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,*local_148);
  uVar22 = pVVar15->_origin;
  local_b0 = *local_148;
  __l._M_len = 1;
  __l._M_array = &local_b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d0,__l,&local_151);
  this_00 = &pCVar21->viewGroups;
  std::
  vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
  ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              *)this_00,&local_d0);
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_150->viewToGroupMapping[*local_148] = 0;
  if (8 < (ulong)((long)iStack_140._M_current - (long)local_148)) {
    uVar11 = 1;
    sVar10 = 0;
    do {
      pVVar15 = QueryCompiler::getView
                          ((local_150->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           local_148[uVar11]);
      uVar3 = pVVar15->_origin;
      if ((multifaq::cppgen::MULTI_OUTPUT == '\x01') && (uVar22 == uVar3)) {
        pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                 ((this_00->
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + sVar10);
        iVar4._M_current = *(unsigned_long **)(pvVar2 + 8);
        if (iVar4._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar4,local_148 + uVar11);
        }
        else {
          *iVar4._M_current = local_148[uVar11];
          *(unsigned_long **)(pvVar2 + 8) = iVar4._M_current + 1;
        }
      }
      else {
        local_b0 = local_148[uVar11];
        __l_00._M_len = 1;
        __l_00._M_array = &local_b0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_d0,__l_00,&local_151);
        std::
        vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
        ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    *)this_00,&local_d0);
        if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        sVar10 = sVar10 + 1;
      }
      local_150->viewToGroupMapping[local_148[uVar11]] = sVar10;
      uVar11 = uVar11 + 1;
      uVar22 = uVar3;
    } while (uVar11 < (ulong)((long)iStack_140._M_current - (long)local_148 >> 3));
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_128);
  if (local_148 != (size_t *)0x0) {
    operator_delete(local_148);
  }
  if (local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CppGenerator::computeViewOrdering()
{
    incomingViews = new std::vector<size_t>[_qc->numberOfViews()]();
    viewToGroupMapping = new size_t[_qc->numberOfViews()];

    std::vector<std::vector<size_t>> viewsPerNode(
        _td->numberOfRelations(), std::vector<size_t>());
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        TDNode* baseRelation = _td->getRelation(view->_origin);
        
        size_t numberIncomingViews =
            (view->_origin == view->_destination ? baseRelation->_numOfNeighbors :
             baseRelation->_numOfNeighbors - 1);
        
        std::vector<bool> incViewBitset(_qc->numberOfViews());
        for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
        {
            Aggregate* aggregate = view->_aggregates[aggNo];

            size_t incOffset = 0;
            // First find the all views that contribute to this Aggregate
            for (size_t i = 0; i < aggregate->_agg.size(); ++i)
            {
                for (size_t j = 0; j < numberIncomingViews; ++j)
                {
                    const size_t& incViewID = aggregate->_incoming[incOffset].first;
               
                    // Indicate that this view contributes to some aggregate
                    incViewBitset[incViewID] = 1;
                    ++incOffset;
                }
            }
        }        
        // For each incoming view, check if it contains any vars from the
        // variable order and then add it to the corresponding info
        for (size_t incViewID=0; incViewID < _qc->numberOfViews(); ++incViewID)
            if (incViewBitset[incViewID])
                incomingViews[viewID].push_back(incViewID);

        // Keep track of the views that origin from this node 
        viewsPerNode[view->_origin].push_back(viewID);
    }
    
    /* Next compute the topological order of the views */
    dyn_bitset processedViews(_qc->numberOfViews());
    dyn_bitset queuedViews(_qc->numberOfViews());
    
    // create orderedViewList -> which is empty
    std::vector<size_t> orderedViewList;
    std::queue<size_t> nodesToProcess;
    
    // Find all views that originate from leaf nodes
    for (const size_t& nodeID : _td->_leafNodes)
    {
        for (const size_t& viewID : viewsPerNode[nodeID])
        {
            if (incomingViews[viewID].size() == 0)
            {
                queuedViews.set(viewID);
                nodesToProcess.push(viewID);
            }
        }
    }
    
    while (!nodesToProcess.empty()) // there is a node in the set
    {
        size_t viewID = nodesToProcess.front();
        nodesToProcess.pop();

        orderedViewList.push_back(viewID);
        processedViews.set(viewID);

        const size_t& destination = _qc->getView(viewID)->_destination;

        // For each view that has the same destination 
        for (const size_t& destView : viewsPerNode[destination])
        {
            // check if this has not been processed (case for root nodes)
            if (!processedViews[destView])
            {
                bool candidate = true;
                for (const size_t& incView : incomingViews[destView])
                {    
                    if (!processedViews[incView] && !queuedViews[incView])
                    {
                        candidate = false;
                        break;
                    }
                }
                
                if (candidate && !queuedViews[destView])
                {
                    queuedViews.set(destView);
                    nodesToProcess.push(destView);
                }
            }
        }
    }

    /* Now generate the groups of views according to topological order*/
    size_t prevOrigin = _qc->getView(orderedViewList[0])->_origin;
    viewGroups.push_back({orderedViewList[0]});

    viewToGroupMapping[orderedViewList[0]] = 0;    
    size_t currentGroup = 0;
    for (size_t viewID = 1; viewID < orderedViewList.size(); ++viewID)
    {
        size_t origin = _qc->getView(orderedViewList[viewID])->_origin;
        if (MULTI_OUTPUT && prevOrigin == origin)
        {
            // Combine the two into one set of
            viewGroups[currentGroup].push_back(orderedViewList[viewID]);
            viewToGroupMapping[orderedViewList[viewID]] = currentGroup;
        }
        else
        {
            // Create a new group
            viewGroups.push_back({orderedViewList[viewID]});
            ++currentGroup;
            viewToGroupMapping[orderedViewList[viewID]] = currentGroup;
        }
        prevOrigin = origin;
    }

    /**************** PRINT OUT **********************/
    DINFO("Ordered View List: ");
    for (size_t& i : orderedViewList)
        DINFO(i << ", ");
    DINFO(std::endl);
    DINFO("View Groups: ");
    for (auto& group : viewGroups) {
        for (auto& i : group)
            DINFO(i << "  ");
        DINFO("|");
    }
    DINFO(std::endl);
    /**************** PRINT OUT **********************/
}